

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::ObjectType::Encode(ObjectType *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8Domain);
  KDataStream::Write(stream,this->m_ui8EntityKind);
  KDataStream::Write(stream,this->m_ui8Category);
  KDataStream::Write(stream,this->m_ui8SubCategory);
  return;
}

Assistant:

void ObjectType::Encode( KDataStream & stream ) const
{
    stream << m_ui8Domain
           << m_ui8EntityKind
           << m_ui8Category
           << m_ui8SubCategory;
}